

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Loop::GetMergingBlocks
          (Loop *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *merging_blocks)

{
  _Map_pointer this_00;
  bool bVar1;
  uint32_t blk_id;
  BasicBlock *pBVar2;
  reference ppBVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  reference puVar4;
  size_type sVar5;
  value_type *__x;
  BasicBlock *local_c0;
  uint32_t local_b4;
  const_iterator cStack_b0;
  uint32_t pred_id;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  undefined1 local_84 [12];
  BasicBlock *bb;
  undefined1 local_70 [8];
  stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
  to_visit;
  CFG *cfg;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *merging_blocks_local;
  Loop *this_local;
  
  pBVar2 = GetMergeBlock(this);
  if (pBVar2 != (BasicBlock *)0x0) {
    to_visit.c.
    super__Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)IRContext::cfg(this->context_)
    ;
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(merging_blocks);
    std::
    stack<spvtools::opt::BasicBlock_const*,std::deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>>
    ::
    stack<std::deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>,void>
              ((stack<spvtools::opt::BasicBlock_const*,std::deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>>
                *)local_70);
    bb = GetMergeBlock(this);
    std::
    stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
    ::push((stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
            *)local_70,&bb);
    while (bVar1 = std::
                   stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
                   ::empty((stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
                            *)local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppBVar3 = std::
                stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
                ::top((stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
                       *)local_70);
      local_84._4_8_ = *ppBVar3;
      std::
      stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
      ::pop((stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
             *)local_70);
      local_84._0_4_ = BasicBlock::id((BasicBlock *)local_84._4_8_);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               merging_blocks,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_84,__x);
      this_00 = to_visit.c.
                super__Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      blk_id = BasicBlock::id((BasicBlock *)local_84._4_8_);
      this_01 = CFG::preds((CFG *)this_00,blk_id);
      __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
      cStack_b0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff50), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3);
        local_b4 = *puVar4;
        bVar1 = IsInsideLoop(this,local_b4);
        if ((!bVar1) &&
           (sVar5 = std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::count(merging_blocks,&local_b4), sVar5 == 0)) {
          local_c0 = CFG::block((CFG *)to_visit.c.
                                       super__Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node,local_b4);
          std::
          stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
          ::push((stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
                  *)local_70,&local_c0);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3);
      }
    }
    std::
    stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
    ::~stack((stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
              *)local_70);
    return;
  }
  __assert_fail("GetMergeBlock() && \"This loop is not structured\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x170,
                "void spvtools::opt::Loop::GetMergingBlocks(std::unordered_set<uint32_t> *) const");
}

Assistant:

void Loop::GetMergingBlocks(
    std::unordered_set<uint32_t>* merging_blocks) const {
  assert(GetMergeBlock() && "This loop is not structured");
  CFG* cfg = context_->cfg();
  merging_blocks->clear();

  std::stack<const BasicBlock*> to_visit;
  to_visit.push(GetMergeBlock());
  while (!to_visit.empty()) {
    const BasicBlock* bb = to_visit.top();
    to_visit.pop();
    merging_blocks->insert(bb->id());
    for (uint32_t pred_id : cfg->preds(bb->id())) {
      if (!IsInsideLoop(pred_id) && !merging_blocks->count(pred_id)) {
        to_visit.push(cfg->block(pred_id));
      }
    }
  }
}